

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall
google::LogDestination::LogDestination
          (LogDestination *this,LogSeverity severity,char *base_filename)

{
  size_t sVar1;
  char *pcVar2;
  rep rVar3;
  allocator<char> local_29;
  
  (this->fileobject_).super_Logger._vptr_Logger = (_func_int **)&PTR__LogFileObject_0012e7e0;
  (this->fileobject_).mutex_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fileobject_).mutex_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->fileobject_).mutex_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->fileobject_).mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->fileobject_).mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->fileobject_).base_filename_selected_ = base_filename != (char *)0x0;
  pcVar2 = "";
  if (base_filename != (char *)0x0) {
    pcVar2 = base_filename;
  }
  (this->fileobject_).base_filename_._M_dataplus._M_p =
       (pointer)&(this->fileobject_).base_filename_.field_2;
  sVar1 = strlen(pcVar2);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->fileobject_).base_filename_,pcVar2,pcVar2 + sVar1);
  pcVar2 = glog_internal_namespace_::ProgramInvocationShortName();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&(this->fileobject_).symlink_basename_,pcVar2,&local_29);
  (this->fileobject_).filename_extension_._M_dataplus._M_p =
       (pointer)&(this->fileobject_).filename_extension_.field_2;
  (this->fileobject_).filename_extension_._M_string_length = 0;
  (this->fileobject_).filename_extension_.field_2._M_local_buf[0] = '\0';
  (this->fileobject_).file_._M_t.super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>.
  _M_t.super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
  super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl = (_IO_FILE *)0x0;
  (this->fileobject_).severity_ = severity;
  (this->fileobject_).bytes_since_flush_ = 0;
  (this->fileobject_).dropped_mem_length_ = 0;
  (this->fileobject_).file_length_ = 0;
  (this->fileobject_).rollover_attempt_ = 0x1f;
  (this->fileobject_).next_flush_time_.__d.__r = 0;
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->fileobject_).start_time_.__d.__r = rVar3;
  this->logger_ = (Logger *)this;
  return;
}

Assistant:

LogDestination::LogDestination(LogSeverity severity, const char* base_filename)
    : fileobject_(severity, base_filename), logger_(&fileobject_) {}